

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_suite.cpp
# Opt level: O1

void int16_suite::test_minus_one(void)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  encoder_type encoder;
  size_type local_68;
  undefined4 local_5c;
  void *local_58;
  long lStack_50;
  long local_48;
  undefined **local_38 [5];
  
  local_38[1] = (undefined **)&local_58;
  local_58 = (void *)0x0;
  lStack_50 = 0;
  local_48 = 0;
  local_38[0] = &PTR__base_00112ca8;
  local_68 = trial::protocol::bintoken::detail::basic_encoder<24UL>::value
                       ((basic_encoder<24UL> *)local_38,-1);
  local_5c = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value(std::int16_t(-1))","3",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/encoder_suite.cpp"
             ,0xf6,"void int16_suite::test_minus_one()",&local_68,&local_5c);
  local_68 = lStack_50 - (long)local_58;
  local_5c = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("buffer.size()","3",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/encoder_suite.cpp"
             ,0xf7,"void int16_suite::test_minus_one()",&local_68,&local_5c);
  local_68._0_4_ = 0xb2;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,unsigned_char,trial::protocol::bintoken::token::code::value>
            ("buffer[0]","token::code::int16",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/encoder_suite.cpp"
             ,0xf8,"void int16_suite::test_minus_one()",local_58,&local_68);
  local_68._0_4_ = 0xff;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("buffer[1]","0xFF",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/encoder_suite.cpp"
             ,0xf9,"void int16_suite::test_minus_one()",(long)local_58 + 1,&local_68);
  local_68 = CONCAT44(local_68._4_4_,0xff);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("buffer[2]","0xFF",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/encoder_suite.cpp"
             ,0xfa,"void int16_suite::test_minus_one()",(long)local_58 + 2,&local_68);
  (*(code *)*local_38[0])();
  if (local_58 != (void *)0x0) {
    operator_delete(local_58,local_48 - (long)local_58);
  }
  return;
}

Assistant:

void test_zero()
{
    std::vector<output_type> buffer;
    encoder_type encoder(buffer);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value(std::int8_t(0)), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(buffer.size(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(buffer[0], 0x00);
}